

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

void __thiscall
ipx::BasicLu::_GetFactors
          (BasicLu *this,SparseMatrix *L,SparseMatrix *U,Int *rowperm,Int *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  double dVar1;
  double dVar2;
  lu_int lVar3;
  reference pvVar4;
  logic_error *this_00;
  value_type_conflict2 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  long in_R9;
  Int k;
  Int rank;
  Int num_dropped;
  Int status;
  Int unz;
  Int lnz;
  Int dim;
  double *Uvalue;
  double *Lvalue;
  Int *Uindex;
  Int *Lindex;
  Int *Ubegin;
  Int *Lbegin;
  double *in_stack_00000200;
  lu_int *in_stack_00000208;
  double *in_stack_00000210;
  lu_int *in_stack_00000218;
  double *in_stack_00000220;
  lu_int *in_stack_00000228;
  lu_int *in_stack_00000240;
  double *in_stack_00000248;
  lu_int *in_stack_00000250;
  lu_int *in_stack_00000258;
  lu_int *in_stack_00000260;
  lu_int *in_stack_00000268;
  double *in_stack_00000270;
  lu_int *in_stack_00000278;
  lu_int *in_stack_00000280;
  double *in_stack_00000288;
  undefined8 in_stack_fffffffffffffec0;
  Int min_capacity;
  undefined8 in_stack_fffffffffffffec8;
  SparseMatrix *in_stack_fffffffffffffed0;
  int local_b8;
  double *local_88;
  SparseMatrix *local_70;
  
  min_capacity = (Int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_70 = (SparseMatrix *)0x0;
  local_88 = (double *)0x0;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x40);
  dVar1 = *pvVar4;
  if (in_RSI != 0) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x4c);
    SparseMatrix::resize
              (in_stack_fffffffffffffed0,(Int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (Int)in_stack_fffffffffffffec8,min_capacity);
    SparseMatrix::colptr((SparseMatrix *)0x808ec8);
    SparseMatrix::rowidx((SparseMatrix *)0x808edd);
    local_88 = SparseMatrix::values((SparseMatrix *)0x808ef2);
  }
  if (in_RDX != 0) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x4d);
    SparseMatrix::resize
              (in_stack_fffffffffffffed0,(Int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (Int)in_stack_fffffffffffffec8,min_capacity);
    local_70 = (SparseMatrix *)SparseMatrix::colptr((SparseMatrix *)0x808f60);
    SparseMatrix::rowidx((SparseMatrix *)0x808f75);
    SparseMatrix::values((SparseMatrix *)0x808f8a);
  }
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x808fa3);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x808fb9);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x808fcf);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x808fe8);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x808ffe);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x809017);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809030);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x80904c);
  lVar3 = basiclu_get_factors(in_stack_00000228,in_stack_00000220,in_stack_00000218,
                              in_stack_00000210,in_stack_00000208,in_stack_00000200,
                              in_stack_00000240,in_stack_00000248,in_stack_00000250,
                              in_stack_00000258,in_stack_00000260,in_stack_00000268,
                              in_stack_00000270,in_stack_00000278,in_stack_00000280,
                              in_stack_00000288);
  if (lVar3 == 0) {
    if (in_RSI != 0) {
      RemoveDiagonal(local_70,local_88);
    }
    if (in_R9 != 0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x65);
      dVar2 = *pvVar4;
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x8091c9);
      for (local_b8 = (int)dVar2; local_b8 < (int)dVar1; local_b8 = local_b8 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back(in_R8,in_RCX);
      }
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"basiclu_get_factors failed");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void BasicLu::_GetFactors(SparseMatrix* L, SparseMatrix* U, Int* rowperm,
                          Int* colperm, std::vector<Int>* dependent_cols) {
    Int *Lbegin = nullptr, *Ubegin = nullptr;
    Int *Lindex = nullptr, *Uindex = nullptr;
    double *Lvalue = nullptr, *Uvalue = nullptr;
    Int dim = xstore_[BASICLU_DIM];
   
    if (L) {
        Int lnz = xstore_[BASICLU_LNZ];
        L->resize(dim, dim, dim+lnz);
        Lbegin = L->colptr();
        Lindex = L->rowidx();
        Lvalue = L->values();
    }
    if (U) {
        Int unz = xstore_[BASICLU_UNZ];
        U->resize(dim, dim, dim+unz);
        Ubegin = U->colptr();
        Uindex = U->rowidx();
        Uvalue = U->values();
    }
    Int status = basiclu_get_factors(istore_.data(), xstore_.data(),
                                     Li_.data(), Lx_.data(),
                                     Ui_.data(), Ux_.data(),
                                     Wi_.data(), Wx_.data(),
                                     rowperm, colperm,
                                     Lbegin, Lindex, Lvalue,
                                     Ubegin, Uindex, Uvalue);
    if (status != BASICLU_OK)
        throw std::logic_error("basiclu_get_factors failed");

    if (L) {
        // Remove unit diagonal from L.
        Int num_dropped = RemoveDiagonal(*L, nullptr);
        assert(num_dropped == dim);
    }
    if (dependent_cols) {
        // Dependent columns are at the end of the BASICLU pivot sequence.
        Int rank = xstore_[BASICLU_RANK];
        dependent_cols->clear();
        for (Int k = rank; k < dim; k++)
            dependent_cols->push_back(k);
    }
}